

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_ext_list(lysc_ext_instance *ext,char *name,uint32_t options,lyd_node **node,...)

{
  char in_AL;
  lysc_node *schema_00;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  size_t local_1b0;
  undefined8 *local_1a8;
  uint *local_190;
  size_t *local_178;
  ly_ctx *local_160;
  undefined1 local_158 [32];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  LY_VALUE_FORMAT local_9c;
  LY_VALUE_FORMAT local_98;
  LY_ERR ret___1;
  LY_ERR ret__;
  LY_VALUE_FORMAT format;
  ly_bool store_only;
  ulong uStack_88;
  LY_ERR rc;
  size_t key_len;
  char *key_val;
  va_list ap;
  ly_ctx *ctx;
  lysc_node *key_s;
  lysc_node *schema;
  lyd_node *key;
  lyd_node *ret;
  lyd_node **node_local;
  char *pcStack_20;
  uint32_t options_local;
  char *name_local;
  lysc_ext_instance *ext_local;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  key = (lyd_node *)0x0;
  if (ext == (lysc_ext_instance *)0x0) {
    local_160 = (ly_ctx *)0x0;
  }
  else {
    local_160 = ext->module->ctx;
  }
  format = LY_VALUE_CANON;
  ret__._3_1_ = (options & 2) != 0;
  local_138 = in_R8;
  local_130 = in_R9;
  ret = (lyd_node *)node;
  node_local._4_4_ = options;
  pcStack_20 = name;
  name_local = (char *)ext;
  if (ext == (lysc_ext_instance *)0x0) {
    ly_log(local_160,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ext","lyd_new_ext_list");
    ext_local._4_4_ = LY_VALUE_XML;
  }
  else if (node == (lyd_node **)0x0) {
    ly_log(local_160,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","node","lyd_new_ext_list");
    ext_local._4_4_ = LY_VALUE_XML;
  }
  else if (name == (char *)0x0) {
    ly_log(local_160,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name","lyd_new_ext_list");
    ext_local._4_4_ = LY_VALUE_XML;
  }
  else {
    local_98 = lyd_new_val_get_format(options,&ret___1);
    ext_local._4_4_ = local_98;
    if (local_98 == LY_VALUE_CANON) {
      if ((ret__._3_1_ == LY_SUCCESS >> 0x18) ||
         ((ret___1 != LY_SUCCESS && (ret___1 != LY_ENOTFOUND)))) {
        schema_00 = lysc_ext_find_node((lysc_ext_instance *)name_local,(lys_module *)0x0,pcStack_20,
                                       0,0x10,0);
        if (schema_00 == (lysc_node *)0x0) {
          if (*(long *)(name_local + 8) == 0) {
            ly_log(local_160,LY_LLERR,LY_EINVAL,
                   "List node \"%s\" not found in instance of extension %s.",pcStack_20,
                   **(undefined8 **)name_local);
          }
          else {
            ly_log(local_160,LY_LLERR,LY_EINVAL,
                   "List node \"%s\" not found in instance \"%s\" of extension %s.",pcStack_20,
                   *(undefined8 *)(name_local + 8),**(undefined8 **)name_local);
          }
          ext_local._4_4_ = LY_VALUE_LYB;
        }
        else {
          local_9c = lyd_create_inner(schema_00,&key);
          ext_local._4_4_ = local_9c;
          if (local_9c == LY_VALUE_CANON) {
            ap[0].overflow_arg_area = local_158;
            ap[0]._0_8_ = &stack0x00000008;
            key_val._4_4_ = 0x30;
            key_val._0_4_ = 0x20;
            ctx = (ly_ctx *)lysc_node_child(schema_00);
            while( true ) {
              bVar1 = false;
              if (ctx != (ly_ctx *)0x0) {
                bVar1 = ((ulong)(ctx->dict).hash_tab & 0x1000000) != 0;
              }
              if (!bVar1) break;
              if (ret___1 == LY_ENOTFOUND) {
                if ((uint)key_val < 0x29) {
                  local_178 = (size_t *)((long)(int)(uint)key_val + (long)ap[0].overflow_arg_area);
                  key_val._0_4_ = (uint)key_val + 8;
                }
                else {
                  local_178 = (size_t *)ap[0]._0_8_;
                  ap[0]._0_8_ = ap[0]._0_8_ + 8;
                }
                key_len = *local_178;
                if ((uint)key_val < 0x29) {
                  local_190 = (uint *)((long)(int)(uint)key_val + (long)ap[0].overflow_arg_area);
                  key_val._0_4_ = (uint)key_val + 8;
                }
                else {
                  local_190 = (uint *)ap[0]._0_8_;
                  ap[0]._0_8_ = ap[0]._0_8_ + 8;
                }
                uStack_88 = (ulong)*local_190;
              }
              else {
                if ((uint)key_val < 0x29) {
                  local_1a8 = (undefined8 *)
                              ((long)(int)(uint)key_val + (long)ap[0].overflow_arg_area);
                  key_val._0_4_ = (uint)key_val + 8;
                }
                else {
                  local_1a8 = (undefined8 *)ap[0]._0_8_;
                  ap[0]._0_8_ = ap[0]._0_8_ + 8;
                }
                key_len = *local_1a8;
                if ((char *)key_len == (char *)0x0) {
                  local_1b0 = 0;
                }
                else {
                  local_1b0 = strlen((char *)key_len);
                }
                uStack_88 = local_1b0;
              }
              format = lyd_create_term((lysc_node *)ctx,(char *)key_len,uStack_88,'\0',ret__._3_1_,
                                       (ly_bool *)0x0,ret___1,(void *)0x0,0x3f3,(ly_bool *)0x0,
                                       (lyd_node **)&schema);
              if (format != LY_VALUE_CANON) break;
              lyd_insert_node(key,(lyd_node **)0x0,(lyd_node *)schema,1);
              ctx = *(ly_ctx **)((long)&(ctx->dict).lock + 0x10);
            }
            if (format != LY_VALUE_CANON) {
              lyd_free_tree(key);
              key = (lyd_node *)0x0;
            }
            *(lyd_node **)ret = key;
            ext_local._4_4_ = format;
          }
        }
      }
      else {
        ly_log(local_160,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
               "!(store_only && (format == LY_VALUE_CANON || format == LY_VALUE_LYB))",
               "lyd_new_ext_list");
        ext_local._4_4_ = LY_VALUE_XML;
      }
    }
  }
  return ext_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_ext_list(const struct lysc_ext_instance *ext, const char *name, uint32_t options, struct lyd_node **node, ...)
{
    struct lyd_node *ret = NULL, *key;
    const struct lysc_node *schema, *key_s;
    struct ly_ctx *ctx = ext ? ext->module->ctx : NULL;
    va_list ap;
    const char *key_val;
    size_t key_len;
    LY_ERR rc = LY_SUCCESS;
    ly_bool store_only = (options & LYD_NEW_VAL_STORE_ONLY) ? 1 : 0;
    LY_VALUE_FORMAT format;

    LY_CHECK_ARG_RET(ctx, ext, node, name, LY_EINVAL);
    LY_CHECK_RET(lyd_new_val_get_format(options, &format));
    LY_CHECK_ARG_RET(ctx, !(store_only && (format == LY_VALUE_CANON || format == LY_VALUE_LYB)), LY_EINVAL);

    schema = lysc_ext_find_node(ext, NULL, name, 0, LYS_LIST, 0);
    if (!schema) {
        if (ext->argument) {
            LOGERR(ctx, LY_EINVAL, "List node \"%s\" not found in instance \"%s\" of extension %s.",
                    name, ext->argument, ext->def->name);
        } else {
            LOGERR(ctx, LY_EINVAL, "List node \"%s\" not found in instance of extension %s.", name, ext->def->name);
        }
        return LY_ENOTFOUND;
    }
    /* create list inner node */
    LY_CHECK_RET(lyd_create_inner(schema, &ret));

    va_start(ap, node);

    /* create and insert all the keys */
    for (key_s = lysc_node_child(schema); key_s && (key_s->flags & LYS_KEY); key_s = key_s->next) {
        if (format == LY_VALUE_LYB) {
            key_val = va_arg(ap, const void *);
            key_len = va_arg(ap, uint32_t);
        } else {
            key_val = va_arg(ap, const char *);
            key_len = key_val ? strlen((char *)key_val) : 0;
        }
        rc = lyd_create_term(key_s, key_val, key_len, 0, store_only, NULL, format, NULL, LYD_HINT_DATA, NULL, &key);
        LY_CHECK_GOTO(rc, cleanup);
        lyd_insert_node(ret, NULL, key, LYD_INSERT_NODE_LAST);
    }

cleanup:
    va_end(ap);
    if (rc) {
        lyd_free_tree(ret);
        ret = NULL;
    }
    *node = ret;
    return rc;
}